

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_pbeh.c
# Opt level: O2

void relpbe_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double xpars [2];
  double local_28 [3];
  
  dVar2 = get_ext_param(p,ext_params,0);
  dVar3 = get_ext_param(p,ext_params,1);
  dVar4 = get_ext_param(p,ext_params,2);
  dVar5 = get_ext_param(p,ext_params,3);
  dVar6 = get_ext_param(p,ext_params,4);
  xpars[1] = get_ext_param(p,ext_params,5);
  local_28[1] = 0.031090690869654894;
  local_28[2] = 1.0;
  xpars[0] = dVar5;
  local_28[0] = dVar6;
  xc_func_set_ext_params(*p->func_aux,xpars);
  xc_func_set_ext_params(p->func_aux[1],local_28);
  pdVar1 = p->mix_coef;
  *pdVar1 = 1.0 - dVar2;
  pdVar1[1] = dVar3;
  pdVar1[2] = dVar4 - dVar3;
  p->cam_alpha = dVar2;
  return;
}

Assistant:

static void
relpbe_set_ext_params(xc_func_type *p, const double *ext_params)
{
  /* Input parameters */
  double cx;
  double scalggac;
  double scalldac;
  double xkappa;
  double cbetapbe;
  double xmuepbe;

  /* Arrays to pass parameters to internal PBE functionals */
  double xpars[2];
  double cpars[3];

  assert(p != NULL);
  cx = get_ext_param(p, ext_params, 0);
  scalggac = get_ext_param(p, ext_params, 1);
  scalldac = get_ext_param(p, ext_params, 2);
  xkappa = get_ext_param(p, ext_params, 3);
  cbetapbe = get_ext_param(p, ext_params, 4);
  xmuepbe = get_ext_param(p, ext_params, 5);

  /* Collect exchange and correlation parameters */
  xpars[0] = xkappa;
  xpars[1] = xmuepbe;
  cpars[0] = cbetapbe;
  cpars[1] = 0.031090690869654895034; /* PBE default value */
  cpars[2] = 1.0; /* PBE default value */

  /* Set x and c parameters */
  xc_func_set_ext_params(p->func_aux[0], xpars);
  xc_func_set_ext_params(p->func_aux[1], cpars);

  /* Set mixing parameters */
  p->mix_coef[0] = 1.0 - cx;
  p->mix_coef[1] = scalggac;
  p->mix_coef[2] = scalldac-scalggac;

  p->cam_alpha = cx;
}